

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRU.cpp
# Opt level: O2

void LruUnhitUnspace(void)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  
  if (t_assoc == set_associative) {
    i = i_cache_set * current_set;
    uVar3 = LRU_priority[i];
    temp = uVar3;
    for (; i < (current_set + 1) * i_cache_set; i = i + 1) {
      uVar2 = LRU_priority[i];
      if (uVar3 <= uVar2) {
        uVar3 = uVar2;
        j = i;
        temp = uVar2;
      }
    }
  }
  else {
    if (t_assoc != full_associative) {
      return;
    }
    temp = LRU_priority[0];
    uVar2 = LRU_priority[0];
    for (uVar3 = 0; i = i_num_line, i_num_line != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = LRU_priority[uVar3];
      if (uVar2 <= uVar1) {
        uVar2 = uVar1;
        j = uVar3;
        temp = uVar1;
      }
    }
  }
  current_line = j;
  return;
}

Assistant:

void LruUnhitUnspace()
{
    if(t_assoc == full_associative)
    {
        temp = LRU_priority[0];

        for(i=0; i<i_num_line; i++)
        {
            if(LRU_priority[i]>=temp)
            {
                temp = LRU_priority[i];
                j = i;
            }
        }

        current_line = j;
    }

    if(t_assoc == set_associative)
    {
        temp = LRU_priority[current_set*i_cache_set];

        for(i=(current_set*i_cache_set); i<((current_set+1)*i_cache_set); i++)
        {
            if(LRU_priority[i]>=temp)
            {
                temp = LRU_priority[i];
                j = i;
            }
        }

        current_line = j;
    }
}